

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O0

test_call_type
__dispatch_divisor<unsigned_short>_std____cxx11__string_const___(string *divisor_type)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  error *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  *local_228;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
  local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
  local_1c8;
  const_iterator call;
  _func_void_long_unsigned_long *local_1b8;
  _func_void_long_unsigned_long *local_1b0;
  _func_void_long_unsigned_long *local_1a8;
  _func_void_long_unsigned_long *local_1a0;
  _func_void_long_unsigned_long *local_198;
  _func_void_long_unsigned_long *local_190;
  _func_void_long_unsigned_long *local_188 [3];
  _func_void_long_unsigned_long *local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  *local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_48;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  string *divisor_type_local;
  
  local_10 = (undefined1  [8])divisor_type;
  if (dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::test_calls_abi_cxx11_ == '\0')
  {
    iVar2 = __cxa_guard_acquire(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                                 test_calls_abi_cxx11_);
    if (iVar2 != 0) {
      local_168 = &local_160;
      local_170 = test_all<unsigned_short,unsigned_char>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [6])"uint8",&local_170);
      local_168 = &local_138;
      local_188[0] = test_all<unsigned_short,unsigned_short>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[7],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [7])"uint16",local_188);
      local_168 = &local_110;
      local_190 = test_all<unsigned_short,unsigned_int>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[7],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [7])"uint32",&local_190);
      local_168 = &local_e8;
      local_198 = test_all<unsigned_short,unsigned_long>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[7],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [7])"uint64",&local_198);
      local_168 = &local_c0;
      local_1a0 = test_all<unsigned_short,signed_char>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[5],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [5])0x134015,&local_1a0);
      local_168 = &local_98;
      local_1a8 = test_all<unsigned_short,short>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [6])0x13401b,&local_1a8);
      local_168 = &local_70;
      local_1b0 = test_all<unsigned_short,int>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [6])0x134022,&local_1b0);
      local_168 = &local_48;
      local_1b8 = test_all<unsigned_short,long>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (local_168,(char (*) [6])(anon_var_dwarf_1c52f + 0x73),&local_1b8);
      local_20 = &local_160;
      local_18 = 8;
      this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>
              *)((long)&call.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
                        ._M_cur + 5);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>
      ::allocator(this);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>_>
      ::unordered_map(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                       test_calls_abi_cxx11_,__l,0,
                      (hasher *)
                      ((long)&call.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
                              ._M_cur + 7),
                      (key_equal *)
                      ((long)&call.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
                              ._M_cur + 6),this);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>
                    *)((long)&call.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
                              ._M_cur + 5));
      local_228 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
                   *)&local_20;
      do {
        local_228 = local_228 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
        ::~pair(local_228);
      } while (local_228 != &local_160);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>_>
                   ::~unordered_map,
                   &dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                    test_calls_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                           test_calls_abi_cxx11_);
    }
  }
  local_1c8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>_>
       ::find(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::test_calls_abi_cxx11_,
              (key_type *)local_10);
  local_1d0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>_>
       ::end(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::test_calls_abi_cxx11_);
  bVar1 = std::__detail::operator!=(&local_1c8,&local_1d0);
  if (!bVar1) {
    this_00 = (error *)__cxa_allocate_exception(0x10);
    burst::literals::operator____u8s_abi_cxx11_(&local_210,anon_var_dwarf_1c93c,0x3a);
    std::operator+(&local_1f0,&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
    boost::program_options::error::error(this_00,&local_1f0);
    __cxa_throw(this_00,&boost::program_options::error::typeinfo,
                boost::program_options::error::~error);
  }
  pvVar3 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_false,_true>
                         *)&local_1c8);
  return (test_call_type)pvVar3->second;
}

Assistant:

test_call_type dispatch_divisor (const std::string & divisor_type)
{
    static const auto test_calls =
        std::unordered_map<std::string, test_call_type>
        {
            {"uint8", &test_all<Integer, std::uint8_t>},
            {"uint16", &test_all<Integer, std::uint16_t>},
            {"uint32", &test_all<Integer, std::uint32_t>},
            {"uint64", &test_all<Integer, std::uint64_t>},
            {"int8", &test_all<Integer, std::int8_t>},
            {"int16", &test_all<Integer, std::int16_t>},
            {"int32", &test_all<Integer, std::int32_t>},
            {"int64", &test_all<Integer, std::int64_t>}
        };

    auto call = test_calls.find(divisor_type);
    if (call != test_calls.end())
    {
        return call->second;
    }
    else
    {
        throw boost::program_options::error(u8"Неверная разрядность делителя: "_u8s + divisor_type);
    }
}